

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_schema_entry.cpp
# Opt level: O1

optional_ptr<duckdb::CatalogEntry,_true> __thiscall
duckdb::DuckSchemaEntry::CreateCollation
          (DuckSchemaEntry *this,CatalogTransaction transaction,CreateCollationInfo *info)

{
  bool bVar1;
  Catalog *catalog;
  CollateCatalogEntry *this_00;
  pointer pCVar2;
  optional_ptr<duckdb::CatalogEntry,_true> oVar3;
  templated_unique_single_t collation;
  _Head_base<0UL,_duckdb::CollateCatalogEntry_*,_false> local_38;
  _Head_base<0UL,_duckdb::CollateCatalogEntry_*,_false> local_30;
  
  catalog = (this->super_SchemaCatalogEntry).super_InCatalogEntry.catalog;
  this_00 = (CollateCatalogEntry *)operator_new(0x250);
  CollateCatalogEntry::CollateCatalogEntry(this_00,catalog,&this->super_SchemaCatalogEntry,info);
  bVar1 = (info->super_CreateInfo).internal;
  local_30._M_head_impl = this_00;
  pCVar2 = unique_ptr<duckdb::CollateCatalogEntry,_std::default_delete<duckdb::CollateCatalogEntry>,_true>
           ::operator->((unique_ptr<duckdb::CollateCatalogEntry,_std::default_delete<duckdb::CollateCatalogEntry>,_true>
                         *)&local_30);
  local_38._M_head_impl = local_30._M_head_impl;
  (pCVar2->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.internal = bVar1;
  local_30._M_head_impl = (CollateCatalogEntry *)0x0;
  oVar3 = AddEntry(this,transaction,
                   (unique_ptr<duckdb::StandardEntry,_std::default_delete<duckdb::StandardEntry>,_true>
                    *)&local_38,(info->super_CreateInfo).on_conflict);
  if (local_38._M_head_impl != (CollateCatalogEntry *)0x0) {
    (*((local_38._M_head_impl)->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
      _vptr_CatalogEntry[1])();
  }
  local_38._M_head_impl = (CollateCatalogEntry *)0x0;
  if (local_30._M_head_impl != (CollateCatalogEntry *)0x0) {
    (*((local_30._M_head_impl)->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
      _vptr_CatalogEntry[1])();
  }
  return (optional_ptr<duckdb::CatalogEntry,_true>)oVar3.ptr;
}

Assistant:

optional_ptr<CatalogEntry> DuckSchemaEntry::CreateCollation(CatalogTransaction transaction, CreateCollationInfo &info) {
	auto collation = make_uniq<CollateCatalogEntry>(catalog, *this, info);
	collation->internal = info.internal;
	return AddEntry(transaction, std::move(collation), info.on_conflict);
}